

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.h
# Opt level: O3

void __thiscall SNMPPacket::SNMPPacket(SNMPPacket *this)

{
  this->_vptr_SNMPPacket = (_func_int **)&PTR__SNMPPacket_00115748;
  this->reuse = false;
  (this->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->communityStringPtr).super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->communityStringPtr).super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->communityStringPtr).super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = 0;
  *(undefined8 *)((long)&this->requestID + 4) = 0;
  (this->communityString)._M_dataplus._M_p = (pointer)&(this->communityString).field_2;
  (this->communityString)._M_string_length = 0;
  (this->communityString).field_2._M_local_buf[0] = '\0';
  (this->varbindList).super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->varbindList).super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->varbindList).super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->varbindList).super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->varbindList).super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->varbindList).super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->varbindList).super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->varbindList).super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->varbindList).super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->varbindList).super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<VarBind,_std::allocator<VarBind>_>::_M_initialize_map
            (&(this->varbindList).super__Deque_base<VarBind,_std::allocator<VarBind>_>,0);
  this->errorStatus = (ErrorStatus)0x0;
  this->errorIndex = (ErrorIndex)0x0;
  this->packet = (ComplexType *)0x0;
  return;
}

Assistant:

SNMPPacket(){}